

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxStructMember::FxStructMember
          (FxStructMember *this,FxExpression *x,PField *mem,FScriptPosition *pos)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_StructMember;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStructMember_00710930;
  this->classx = x;
  this->membervar = mem;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxStructMember::FxStructMember(FxExpression *x, PField* mem, const FScriptPosition &pos)
	: FxExpression(EFX_StructMember, pos)
{
	classx = x;
	membervar = mem;
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}